

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::get_remote_ip_and_port
               (sockaddr_storage *addr,socklen_t addr_len,string *ip,int *port)

{
  uint16_t uVar1;
  int iVar2;
  pointer pvVar3;
  size_type sVar4;
  undefined1 local_429 [8];
  array<char,_1025UL> ipstr;
  int *port_local;
  string *ip_local;
  socklen_t addr_len_local;
  sockaddr_storage *addr_local;
  
  ipstr._M_elems._1017_8_ = port;
  if (addr->ss_family == 2) {
    uVar1 = ntohs(*(uint16_t *)addr->__ss_padding);
    *(uint *)ipstr._M_elems._1017_8_ = (uint)uVar1;
  }
  else if (addr->ss_family == 10) {
    uVar1 = ntohs(*(uint16_t *)addr->__ss_padding);
    *(uint *)ipstr._M_elems._1017_8_ = (uint)uVar1;
  }
  memset(local_429,0,0x401);
  pvVar3 = std::array<char,_1025UL>::data((array<char,_1025UL> *)local_429);
  sVar4 = std::array<char,_1025UL>::size((array<char,_1025UL> *)local_429);
  iVar2 = getnameinfo((sockaddr *)addr,addr_len,pvVar3,(socklen_t)sVar4,(char *)0x0,0,1);
  if (iVar2 == 0) {
    pvVar3 = std::array<char,_1025UL>::data((array<char,_1025UL> *)local_429);
    std::__cxx11::string::operator=((string *)ip,pvVar3);
  }
  return;
}

Assistant:

inline void get_remote_ip_and_port(const struct sockaddr_storage &addr,
										   socklen_t addr_len, std::string &ip,
										   int &port) {
			if (addr.ss_family == AF_INET) {
				port = ntohs(reinterpret_cast<const struct sockaddr_in *>(&addr)->sin_port);
			} else if (addr.ss_family == AF_INET6) {
				port =
						ntohs(reinterpret_cast<const struct sockaddr_in6 *>(&addr)->sin6_port);
			}

			std::array<char, NI_MAXHOST> ipstr{};
			if (!getnameinfo(reinterpret_cast<const struct sockaddr *>(&addr), addr_len,
							 ipstr.data(), static_cast<socklen_t>(ipstr.size()), nullptr,
							 0, NI_NUMERICHOST)) {
				ip = ipstr.data();
			}
		}